

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

long * __thiscall
google::protobuf::RepeatedField<long>::elements(RepeatedField<long> *this,bool is_soo)

{
  int iVar1;
  long *plVar2;
  string *psVar3;
  void *ptr;
  RepeatedField<long> *this_00;
  long lVar4;
  int iVar5;
  undefined7 in_register_00000031;
  SooRep *this_01;
  Arena *this_02;
  Arena *pAStack_68;
  long lStack_60;
  SooRep *pSStack_58;
  undefined1 auStack_50 [24];
  SooRep local_20;
  
  iVar5 = 1;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    iVar5 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar5 < 1) {
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar5,0,"Capacity(is_soo) > 0");
  }
  else {
    psVar3 = (string *)0x0;
  }
  if (psVar3 == (string *)0x0) {
    if (is_soo) {
      return (long *)((long)&(this->soo_rep_).field_0 + 8);
    }
    plVar2 = (long *)internal::LongSooRep::elements((LongSooRep *)this);
    return plVar2;
  }
  this_01 = &local_20;
  elements();
  this_02 = (Arena *)auStack_50;
  iVar5 = (int)psVar3;
  lVar4 = (long)iVar5;
  auStack_50._16_8_ = this;
  if (iVar5 < 0) {
    pSStack_58 = (SooRep *)0x2660bc;
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>(lVar4,0,"index >= 0");
  }
  else {
    psVar3 = (string *)0x0;
  }
  if (psVar3 == (string *)0x0) {
    pSStack_58 = (SooRep *)0x266081;
    iVar1 = internal::SooRep::size
                      (this_01,(undefined1  [16])
                               ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                               (undefined1  [16])0x0);
    if (iVar5 < iVar1) {
      psVar3 = (string *)0x0;
    }
    else {
      pSStack_58 = (SooRep *)0x2660d0;
      psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (lVar4,(long)iVar1,"index < size()");
    }
    if (psVar3 == (string *)0x0) {
      pSStack_58 = (SooRep *)0x26609e;
      plVar2 = elements((RepeatedField<long> *)this_01,
                        (undefined1  [16])
                        ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                        (undefined1  [16])0x0);
      return plVar2 + lVar4;
    }
  }
  else {
    pSStack_58 = (SooRep *)0x2660dd;
    Mutable();
  }
  pSStack_58 = (SooRep *)Arena::CreateArenaCompatible<google::protobuf::RepeatedField<long>>;
  Mutable();
  lStack_60 = lVar4;
  pSStack_58 = this_01;
  if (this_02 == (Arena *)0x0) {
    this_00 = (RepeatedField<long> *)operator_new(0x10);
    RepeatedField(this_00,(Arena *)0x0);
  }
  else {
    ptr = Arena::Allocate(this_02,0x10);
    pAStack_68 = this_02;
    this_00 = Arena::InternalHelper<google::protobuf::RepeatedField<long>>::
              Construct<google::protobuf::Arena*>(ptr,&pAStack_68);
  }
  return (long *)this_00;
}

Assistant:

Element* elements(bool is_soo) {
    ABSL_DCHECK_GT(Capacity(is_soo), 0);
    return unsafe_elements(is_soo);
  }